

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O1

void __thiscall cmLBDepend::GenerateDependInformation(cmLBDepend *this,cmDependInformation *info)

{
  char *filename;
  cmMakefile *this_00;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  cmSourceFile *pcVar5;
  string *psVar6;
  cmSourceFile *cFile;
  const_iterator file;
  pointer pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string incpath;
  string local_80;
  string local_60;
  string *local_40;
  cmSourceFile *local_38;
  
  if (info->DependDone == false) {
    info->DependDone = true;
    filename = (info->FullPath)._M_dataplus._M_p;
    if (filename == (char *)0x0) {
      cmSystemTools::Error
                ("Attempt to find dependencies for file without path!",(char *)0x0,(char *)0x0,
                 (char *)0x0);
      return;
    }
    bVar2 = cmsys::SystemTools::FileExists(filename,true);
    if (bVar2) {
      DependWalk(this,info);
    }
    pcVar5 = info->SourceFile;
    if ((pcVar5 != (cmSourceFile *)0x0) &&
       (pbVar7 = (pcVar5->Depends).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       pbVar7 != (pcVar5->Depends).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) {
      bVar2 = true;
      for (; pbVar7 != (pcVar5->Depends).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish; pbVar7 = pbVar7 + 1) {
        AddDependency(this,info,(pbVar7->_M_dataplus)._M_p);
      }
    }
    local_40 = (string *)&info->FullPath;
    if (!bVar2) {
      this_00 = this->Makefile;
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      sVar4 = strlen(filename);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,filename,filename + sVar4)
      ;
      cmsys::SystemTools::GetFilenameWithoutExtension(&local_60,&local_80);
      pcVar5 = cmMakefile::GetSource(this_00,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if (pcVar5 != (cmSourceFile *)0x0) {
        psVar6 = cmSourceFile::GetFullPath(pcVar5,(string *)0x0);
        iVar3 = std::__cxx11::string::compare((char *)psVar6);
        if (iVar3 == 0) {
          bVar2 = true;
        }
        else {
          pbVar7 = (this->IncludeDirectories).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (pbVar7 != (this->IncludeDirectories).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
            local_38 = pcVar5;
            do {
              local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
              pcVar1 = (pbVar7->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_60,pcVar1,pcVar1 + pbVar7->_M_string_length);
              if ((local_60._M_string_length != 0) &&
                 (local_60._M_dataplus._M_p[local_60._M_string_length - 1] != '/')) {
                local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_80,local_60._M_dataplus._M_p,
                           local_60._M_dataplus._M_p + local_60._M_string_length);
                std::__cxx11::string::append((char *)&local_80);
                std::__cxx11::string::operator=((string *)&local_60,(string *)&local_80);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_80._M_dataplus._M_p != &local_80.field_2) {
                  operator_delete(local_80._M_dataplus._M_p,
                                  local_80.field_2._M_allocated_capacity + 1);
                }
              }
              local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_80,local_60._M_dataplus._M_p,
                         local_60._M_dataplus._M_p + local_60._M_string_length);
              std::__cxx11::string::append((char *)&local_80);
              std::__cxx11::string::operator=((string *)&local_60,(string *)&local_80);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != &local_80.field_2) {
                operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1
                               );
              }
              psVar6 = cmSourceFile::GetFullPath(local_38,(string *)0x0);
              sVar4 = psVar6->_M_string_length;
              if ((sVar4 == local_60._M_string_length) &&
                 ((sVar4 == 0 ||
                  (iVar3 = bcmp((psVar6->_M_dataplus)._M_p,local_60._M_dataplus._M_p,sVar4),
                  iVar3 == 0)))) {
                bVar2 = true;
                std::__cxx11::string::_M_assign(local_40);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != &local_60.field_2) {
                operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1
                               );
              }
              pbVar7 = pbVar7 + 1;
            } while (pbVar7 != (this->IncludeDirectories).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
          }
        }
      }
    }
    if (!bVar2) {
      bVar2 = cmsys::RegularExpression::find
                        (&this->ComplainFileRegularExpression,(info->IncludeName)._M_dataplus._M_p);
      if (bVar2) {
        cmSystemTools::Error("error cannot find dependencies for ",filename,(char *)0x0,(char *)0x0)
        ;
      }
      else {
        std::__cxx11::string::_M_replace
                  ((ulong)local_40,0,(char *)(info->FullPath)._M_string_length,0x50ea83);
      }
    }
  }
  return;
}

Assistant:

void GenerateDependInformation(cmDependInformation* info)
  {
    // If dependencies are already done, stop now.
    if(info->DependDone)
      {
      return;
      }
    else
      {
      // Make sure we don't visit the same file more than once.
      info->DependDone = true;
      }
    const char* path = info->FullPath.c_str();
    if(!path)
      {
      cmSystemTools::Error(
            "Attempt to find dependencies for file without path!");
      return;
      }

    bool found = false;

    // If the file exists, use it to find dependency information.
    if(cmSystemTools::FileExists(path, true))
      {
      // Use the real file to find its dependencies.
      this->DependWalk(info);
      found = true;
      }


    // See if the cmSourceFile for it has any files specified as
    // dependency hints.
    if(info->SourceFile != 0)
      {

      // Get the cmSourceFile corresponding to this.
      const cmSourceFile& cFile = *(info->SourceFile);
      // See if there are any hints for finding dependencies for the missing
      // file.
      if(!cFile.GetDepends().empty())
        {
        // Dependency hints have been given.  Use them to begin the
        // recursion.
        for(std::vector<std::string>::const_iterator file =
            cFile.GetDepends().begin(); file != cFile.GetDepends().end();
            ++file)
          {
          this->AddDependency(info, file->c_str());
          }

        // Found dependency information.  We are done.
        found = true;
        }
      }

    if(!found)
      {
      // Try to find the file amongst the sources
      cmSourceFile *srcFile = this->Makefile->GetSource
          (cmSystemTools::GetFilenameWithoutExtension(path));
      if (srcFile)
        {
        if (srcFile->GetFullPath() == path)
          {
          found=true;
          }
        else
          {
          //try to guess which include path to use
          for(std::vector<std::string>::iterator t =
              this->IncludeDirectories.begin();
              t != this->IncludeDirectories.end(); ++t)
            {
            std::string incpath = *t;
            if (!incpath.empty() && incpath[incpath.size() - 1] != '/')
              {
              incpath = incpath + "/";
              }
            incpath = incpath + path;
            if (srcFile->GetFullPath() == incpath)
              {
              // set the path to the guessed path
              info->FullPath = incpath;
              found=true;
              }
            }
          }
        }
      }

    if(!found)
      {
      // Couldn't find any dependency information.
      if(this->ComplainFileRegularExpression.find(info->IncludeName.c_str()))
        {
        cmSystemTools::Error("error cannot find dependencies for ", path);
        }
      else
        {
        // Destroy the name of the file so that it won't be output as a
        // dependency.
        info->FullPath = "";
        }
      }
  }